

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionResetsOnDisconnect::RunImpl
          (TestsessionFixtureSessionResetsOnDisconnect *this)

{
  TestDetails *details;
  sessionFixtureSessionResetsOnDisconnectHelper fixtureHelper;
  sessionFixtureSessionResetsOnDisconnectHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixtureSessionResetsOnDisconnectHelper::sessionFixtureSessionResetsOnDisconnectHelper
            (&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionResetsOnDisconnectHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture(&local_660.super_sessionFixture);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionResetsOnDisconnect) {
  createSession(1);
  object->setResetOnDisconnect(true);
  CHECK(object->getResetOnDisconnect());
}